

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

void __thiscall
TransitionObservationIndependentMADPDiscrete::~TransitionObservationIndependentMADPDiscrete
          (TransitionObservationIndependentMADPDiscrete *this,void **vtt)

{
  void *pvVar1;
  pointer ppMVar2;
  pointer ppJVar3;
  pointer ppJVar4;
  pointer puVar5;
  pointer ppSVar6;
  pointer ppMVar7;
  pointer ppJVar8;
  
  pvVar1 = *vtt;
  *(void **)&this->super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 + *(long *)((long)pvVar1 + -0x40)) =
       vtt[3];
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 +
            *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x48)) = vtt[4];
  ppMVar2 = (this->_m_individualMADPDs).
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar7 = (this->_m_individualMADPDs).
                 super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar7 != ppMVar2;
      ppMVar7 = ppMVar7 + 1) {
    if (*ppMVar7 != (MultiAgentDecisionProcessDiscrete *)0x0) {
      (**(code **)(*(long *)&(*ppMVar7)->super_MultiAgentDecisionProcess + 8))();
    }
  }
  ppMVar7 = (this->_m_individualMADPDs).
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_individualMADPDs).
      super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar7) {
    (this->_m_individualMADPDs).
    super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppMVar7;
  }
  ppJVar3 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar8 = (this->_m_jointActionVec).
                 super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppJVar8 != ppJVar3; ppJVar8 = ppJVar8 + 1
      ) {
    if (*ppJVar8 != (JointActionDiscrete *)0x0) {
      (*((*ppJVar8)->super_JointAction)._vptr_JointAction[1])();
    }
  }
  ppJVar8 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionVec).
      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar8) {
    (this->_m_jointActionVec).
    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppJVar8;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_jointToIndObsCache);
  ppJVar4 = (this->_m_jointObs).
            super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppJVar4 != (pointer)0x0) {
    operator_delete(ppJVar4,(long)(this->_m_jointObs).
                                  super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppJVar4
                   );
  }
  std::
  vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ::~vector(&this->_m_indivObs);
  puVar5 = (this->_m_nrIndivObs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_m_nrIndivObs).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->_m_nrIndivActions).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_m_nrIndivActions).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  ppSVar6 = (this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar6 != (pointer)0x0) {
    operator_delete(ppSVar6,(long)(this->_m_jointStates).
                                  super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppSVar6);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_indivStateIndices);
  puVar5 = (this->_m_nrIndivStates).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_m_nrIndivStates).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->_m_stateStepSize).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_m_stateStepSize).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->_m_observationStepSize).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_m_observationStepSize).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->_m_actionStepSize).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_m_actionStepSize).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_jointToIndActionCache);
  ppJVar8 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppJVar8 != (pointer)0x0) {
    operator_delete(ppJVar8,(long)(this->_m_jointActionVec).
                                  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppJVar8
                   );
  }
  ppMVar7 = (this->_m_individualMADPDs).
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar7 != (pointer)0x0) {
    operator_delete(ppMVar7,(long)(this->_m_individualMADPDs).
                                  super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar7
                   );
  }
  MultiAgentDecisionProcess::~MultiAgentDecisionProcess
            (&this->super_MultiAgentDecisionProcess,vtt + 1);
  return;
}

Assistant:

TransitionObservationIndependentMADPDiscrete::
~TransitionObservationIndependentMADPDiscrete()
{
    // this destructor leaks memory

    vector<MultiAgentDecisionProcessDiscrete*>::iterator it = 
        _m_individualMADPDs.begin();
    vector<MultiAgentDecisionProcessDiscrete*>::iterator last = 
        _m_individualMADPDs.end();
    while(it != last)
    {
        delete *it;//pointer to MultiAgentDecisionProcessDiscrete
        it++;
    }
    _m_individualMADPDs.clear();
    
    vector<JointActionDiscrete*>::iterator it2 = 
        _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::iterator last2 = 
        _m_jointActionVec.end();
    while(it2 != last2)
    {
        delete *it2; //pointer to MultiAgentDecisionProcessDiscrete
        it2++;
    }
    _m_jointActionVec.clear();
}